

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGL3DriverBase::setRenderTargetEx
          (COpenGL3DriverBase *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,
          f32 clearDepth,u8 clearStencil)

{
  E_DRIVER_TYPE EVar1;
  GLuint GVar2;
  COpenGL3CacheHandler *pCVar3;
  E_DRIVER_TYPE EVar4;
  pointer ppIVar5;
  COpenGL3RenderTarget *renderTarget;
  ulong uVar6;
  double __x;
  
  if (target == (IRenderTarget *)0x0) {
    pCVar3 = this->CacheHandler;
    if (pCVar3->FrameBufferID != 0) {
      (*GL.BindFramebuffer)(0x8d40,0);
      pCVar3->FrameBufferID = 0;
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x86])
              (this,(ulong)(this->super_CNullDriver).ScreenSize.Width,
               (ulong)(this->super_CNullDriver).ScreenSize.Height);
    ppIVar5 = (pointer)0x0;
    uVar6 = 0;
  }
  else {
    EVar1 = target->DriverType;
    EVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(this);
    if (EVar1 != EVar4) {
      os::Printer::log((Printer *)
                       "Fatal Error: Tried to set a render target not owned by OpenGL 3 driver.",__x
                      );
      return false;
    }
    pCVar3 = this->CacheHandler;
    GVar2 = *(GLuint *)
             ((long)&target[1].Textures.m_data.
                     super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    if (pCVar3->FrameBufferID != GVar2) {
      (*GL.BindFramebuffer)(0x8d40,GVar2);
      pCVar3->FrameBufferID = GVar2;
    }
    COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::update((COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              *)target);
    ppIVar5 = target[1].Textures.m_data.
              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (ulong)ppIVar5 >> 0x20;
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x86])
              (this,(ulong)ppIVar5 & 0xffffffff,uVar6);
  }
  if (((this->super_CNullDriver).CurrentRenderTargetSize.Width != (uint)ppIVar5) ||
     ((this->super_CNullDriver).CurrentRenderTargetSize.Height != (uint)uVar6)) {
    (this->super_CNullDriver).CurrentRenderTargetSize =
         (dimension2d<unsigned_int>)((ulong)ppIVar5 & 0xffffffff | uVar6 << 0x20);
    this->Transformation3DChanged = true;
  }
  (this->super_CNullDriver).CurrentRenderTarget = target;
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x57])
            ((ulong)(uint)clearDepth,this,clearFlag,clearColor.color,(ulong)clearStencil);
  return true;
}

Assistant:

bool COpenGL3DriverBase::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != getDriverType()) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by OpenGL 3 driver.", ELL_ERROR);
		return false;
	}

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGL3RenderTarget *renderTarget = static_cast<COpenGL3RenderTarget *>(target);

		CacheHandler->setFBO(renderTarget->getBufferID());
		renderTarget->update();

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		CacheHandler->setFBO(0);

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}